

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O1

void __thiscall miniros::Publication::dropAllConnections(Publication *this)

{
  pointer psVar1;
  pointer psVar2;
  int iVar3;
  pointer psVar4;
  vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
  local_28;
  
  local_28.
  super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.
  super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.
  super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->subscriber_links_mutex_);
  if (iVar3 == 0) {
    psVar1 = (this->subscriber_links_).
             super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar2 = (this->subscriber_links_).
             super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar4 = (this->subscriber_links_).
             super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->subscriber_links_).
    super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_28.
         super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->subscriber_links_).
    super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_28.
         super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->subscriber_links_).
    super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_28.
         super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_28.
    super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
    ._M_impl.super__Vector_impl_data._M_start = psVar1;
    local_28.
    super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar2;
    local_28.
    super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar4;
    pthread_mutex_unlock((pthread_mutex_t *)&this->subscriber_links_mutex_);
    for (psVar4 = local_28.
                  super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar4 != local_28.
                  super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; psVar4 = psVar4 + 1) {
      (*((psVar4->super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        _vptr_SubscriberLink[3])();
    }
    std::
    vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
    ::~vector(&local_28);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void Publication::dropAllConnections()
{
  // Swap our publishers list with a local one so we can only lock for a short period of time, because a
  // side effect of our calling drop() on connections can be re-locking the publishers mutex
  V_SubscriberLink local_publishers;

  {
    std::scoped_lock<std::mutex> lock(subscriber_links_mutex_);

    local_publishers.swap(subscriber_links_);
  }

  for (V_SubscriberLink::iterator i = local_publishers.begin();
           i != local_publishers.end(); ++i)
  {
    (*i)->drop();
  }
}